

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O0

bool __thiscall
kway_min_id_heap<int,_4,_std::less<int>_>::push_or_set_key
          (kway_min_id_heap<int,_4,_std::less<int>_> *this,int id,key_type key)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  undefined1 *this_00;
  key_type in_EDX;
  int in_ESI;
  kway_min_id_heap<int,_4,_std::less<int>_> *in_RDI;
  kway_min_id_heap<int,_4,_std::less<int>_> *unaff_retaddr;
  int in_stack_ffffffffffffff9c;
  kway_min_id_heap<int,_4,_std::less<int>_> *in_stack_ffffffffffffffa0;
  vector<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair,_std::allocator<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair>_>
  *pvVar4;
  key_type in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  kway_min_id_heap<int,_4,_std::less<int>_> *in_stack_ffffffffffffffd0;
  less<int> *this_01;
  int pos;
  key_type local_18;
  int local_14;
  int in_stack_fffffffffffffffc;
  
  local_18 = in_EDX;
  local_14 = in_ESI;
  check_id_invariants(in_RDI);
  check_order_invariants(in_RDI);
  bVar1 = contains(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  if (bVar1) {
    this_01 = (less<int> *)&in_RDI->field_0x38;
    pvVar4 = &in_RDI->heap;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->id_pos,(long)local_14);
    pvVar3 = std::
             vector<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair,_std::allocator<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair>_>
             ::operator[](pvVar4,(long)*pvVar2);
    bVar1 = std::less<int>::operator()(this_01,&pvVar3->key,&local_18);
    pos = (int)((ulong)this_01 >> 0x20);
    if (bVar1) {
      pvVar4 = &in_RDI->heap;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->id_pos,(long)local_14);
      pvVar3 = std::
               vector<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair,_std::allocator<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair>_>
               ::operator[](pvVar4,(long)*pvVar2);
      pvVar3->key = local_18;
      std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->id_pos,(long)local_14);
      move_down(unaff_retaddr,in_stack_fffffffffffffffc);
      check_id_invariants(in_RDI);
      check_order_invariants(in_RDI);
      bVar1 = true;
    }
    else {
      this_00 = &in_RDI->field_0x38;
      pvVar4 = &in_RDI->heap;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->id_pos,(long)local_14);
      pvVar3 = std::
               vector<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair,_std::allocator<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair>_>
               ::operator[](pvVar4,(long)*pvVar2);
      bVar1 = std::less<int>::operator()((less<int> *)this_00,&local_18,&pvVar3->key);
      if (bVar1) {
        pvVar4 = &in_RDI->heap;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->id_pos,(long)local_14);
        pvVar3 = std::
                 vector<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair,_std::allocator<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair>_>
                 ::operator[](pvVar4,(long)*pvVar2);
        pvVar3->key = local_18;
        std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->id_pos,(long)local_14);
        move_up(in_RDI,pos);
        check_id_invariants(in_RDI);
        check_order_invariants(in_RDI);
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    }
  }
  else {
    push(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool push_or_set_key(int id, key_type key)
    {
        assert(0 <= id && id < (int)id_pos.size() && "id is in range");

        check_id_invariants();
        check_order_invariants();

        if (!contains(id)) {
            push(id, key);
            return true;
        } else {
            if (order(heap[id_pos[id]].key, key)) {
                heap[id_pos[id]].key = std::move(key);
                move_down(id_pos[id]);

                check_id_invariants();
                check_order_invariants();

                return true;
            } else if (order(key, heap[id_pos[id]].key)) {
                heap[id_pos[id]].key = std::move(key);
                move_up(id_pos[id]);

                check_id_invariants();
                check_order_invariants();

                return true;
            }
        }
        return false;
    }